

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.h
# Opt level: O0

Config * Config::config_instance(void)

{
  Config *this;
  
  if (m_instance == (Config *)0x0) {
    this = (Config *)operator_new(0x1d0);
    Config(this);
    m_instance = this;
  }
  return m_instance;
}

Assistant:

static Config *config_instance() {
        if (m_instance == NULL)
            m_instance = new Config();
        return m_instance;
    }